

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void __thiscall DScroller::Destroy(DScroller *this)

{
  DInterpolation **obj;
  DInterpolation *pDVar1;
  long lVar2;
  
  for (lVar2 = 0x78; lVar2 != 0x90; lVar2 = lVar2 + 8) {
    obj = (DInterpolation **)
          ((long)&(((DScroller *)(this->m_Interpolations + -0xf))->super_DThinker).super_DObject.
                  _vptr_DObject + lVar2);
    pDVar1 = GC::ReadBarrier<DInterpolation>(obj);
    if (pDVar1 != (DInterpolation *)0x0) {
      pDVar1 = GC::ReadBarrier<DInterpolation>(obj);
      DInterpolation::DelRef(pDVar1,false);
      *obj = (DInterpolation *)0x0;
    }
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DScroller::Destroy ()
{
	for(int i=0;i<3;i++)
	{
		if (m_Interpolations[i] != NULL)
		{
			m_Interpolations[i]->DelRef();
			m_Interpolations[i] = NULL;
		}
	}
	Super::Destroy();
}